

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O0

string * __thiscall
cmPolicies::GetRequiredAlwaysPolicyError_abi_cxx11_
          (string *__return_storage_ptr__,cmPolicies *this,PolicyID id)

{
  char *__s;
  char *local_58 [3];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string pid;
  PolicyID id_local;
  
  pid.field_2._12_4_ = SUB84(this,0);
  __s = idToString(pid.field_2._12_4_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
  std::allocator<char>::~allocator(&local_39);
  local_58[0] = idToVersion(pid.field_2._12_4_);
  cmStrCat<char_const(&)[8],std::__cxx11::string&,char_const(&)[130],char_const*,char_const(&)[218],std::__cxx11::string&,char_const(&)[23]>
            (__return_storage_ptr__,(char (*) [8])"Policy ",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [130])
             " may not be set to OLD behavior because this version of CMake no longer supports it.  The policy was introduced in CMake version "
             ,local_58,
             (char (*) [218])
             ", and use of NEW behavior is now required.\nPlease either update your CMakeLists.txt files to conform to the new behavior or use an older version of CMake that still supports the old behavior.  Run cmake --help-policy "
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [23])0x102c2ef);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmPolicies::GetRequiredAlwaysPolicyError(cmPolicies::PolicyID id)
{
  std::string pid = idToString(id);
  return cmStrCat(
    "Policy ", pid,
    " may not be set to OLD behavior because this "
    "version of CMake no longer supports it.  "
    "The policy was introduced in CMake version ",
    idToVersion(id),
    ", and use of NEW behavior is now required."
    "\n"
    "Please either update your CMakeLists.txt files to conform to "
    "the new behavior or use an older version of CMake that still "
    "supports the old behavior.  Run cmake --help-policy ",
    pid, " for more information.");
}